

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

ixy_device * ixy_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues,int interrupt_timeout)

{
  uint16_t uVar1;
  uint16_t uVar2;
  int fd;
  uint32_t uVar3;
  uint uVar4;
  uint16_t in_DX;
  uint16_t in_SI;
  char *in_RDI;
  uint32_t class_id;
  uint16_t device_id;
  uint16_t vendor_id;
  int config;
  int in_stack_00001078;
  uint16_t in_stack_0000107c;
  uint16_t in_stack_0000107e;
  char *in_stack_00001080;
  int in_stack_00001204;
  char *in_stack_00001208;
  char *in_stack_00001210;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  ixy_device *local_8;
  
  fd = pci_open_resource(in_stack_00001210,in_stack_00001208,in_stack_00001204);
  uVar1 = read_io16(fd,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  uVar2 = read_io16(fd,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  uVar3 = read_io32(fd,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  uVar4 = uVar3 >> 0x18;
  close(fd);
  if (uVar4 != 2) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): Device %s is not a NIC\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/device.c",
            0x14,"ixy_init",in_RDI);
    abort();
  }
  if ((uVar1 == 0x1af4) && (0xfff < uVar2)) {
    local_8 = virtio_init(in_RDI,in_SI,in_DX);
  }
  else {
    local_8 = ixgbe_init(in_stack_00001080,in_stack_0000107e,in_stack_0000107c,in_stack_00001078);
  }
  return local_8;
}

Assistant:

struct ixy_device* ixy_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues, int interrupt_timeout) {
	// Read PCI configuration space
	// For VFIO, we could access the config space another way
	// (VFIO_PCI_CONFIG_REGION_INDEX). This is not needed, though, because
	// every config file should be world-readable, and here we
	// only read the vendor and device id.
	int config = pci_open_resource(pci_addr, "config", O_RDONLY);
	uint16_t vendor_id = read_io16(config, 0);
	uint16_t device_id = read_io16(config, 2);
	uint32_t class_id = read_io32(config, 8) >> 24;
	close(config);
	if (class_id != 2) {
		error("Device %s is not a NIC", pci_addr);
	}
	if (vendor_id == 0x1af4 && device_id >= 0x1000) {
		return virtio_init(pci_addr, rx_queues, tx_queues);
	} else {
		// Our best guess is to try ixgbe
		return ixgbe_init(pci_addr, rx_queues, tx_queues, interrupt_timeout);
	}
}